

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void removeRowsOfCountOne(HighsLogOptions *log_options,HighsLp *lp)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  double *pdVar6;
  reference pvVar7;
  reference this;
  int *in_RSI;
  HighsLogOptions *in_RDI;
  HighsInt iCol_4;
  HighsInt iEl_4;
  HighsInt iRow_4;
  HighsInt iCol_3;
  HighsInt iEl_3;
  HighsInt iRow_3;
  HighsInt iEl_2;
  double value;
  HighsInt iCol_2;
  HighsInt row_count;
  HighsInt iRow_2;
  HighsInt newEl;
  HighsInt newRow;
  HighsInt iRow_1;
  HighsInt iEl_1;
  HighsInt iCol_1;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol;
  HighsInt num_row_count_1;
  HighsInt original_num_row;
  HighsInt original_num_nz;
  HighsInt num_nz;
  bool has_name;
  vector<double,_std::allocator<double>_> ar_value;
  vector<int,_std::allocator<int>_> ar_index;
  vector<int,_std::allocator<int>_> ar_start;
  vector<int,_std::allocator<int>_> ar_count;
  vector<int,_std::allocator<int>_> a_count;
  vector<double,_std::allocator<double>_> *a_value;
  vector<int,_std::allocator<int>_> *a_index;
  vector<int,_std::allocator<int>_> *a_start;
  HighsLp row_wise_lp;
  value_type_conflict2 *in_stack_fffffffffffffa48;
  HighsLp *in_stack_fffffffffffffa50;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa60;
  size_type in_stack_fffffffffffffa68;
  value_type vVar8;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  int iVar9;
  HighsLp *in_stack_fffffffffffffac8;
  double dVar10;
  HighsLp *in_stack_fffffffffffffad0;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4bc;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  value_type local_490;
  int local_48c;
  int local_488;
  int local_484;
  int local_480;
  int local_47c;
  int local_478;
  int local_474;
  int local_470;
  int local_46c;
  undefined4 local_468;
  int local_464;
  int local_460;
  undefined4 local_450;
  uint local_44c;
  int local_448;
  value_type local_444;
  value_type local_440;
  byte local_439;
  vector<double,_std::allocator<double>_> local_438;
  vector<int,_std::allocator<int>_> local_420;
  vector<int,_std::allocator<int>_> local_408;
  vector<int,_std::allocator<int>_> local_3f0;
  vector<int,_std::allocator<int>_> local_3d8;
  vector<double,_std::allocator<double>_> *local_3c0;
  HighsLp *local_3b8;
  vector<int,_std::allocator<int>_> *local_3b0;
  int *local_10;
  HighsLogOptions *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  HighsLp::HighsLp(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  local_3b0 = (vector<int,_std::allocator<int>_> *)(local_10 + 0x24);
  local_3b8 = (HighsLp *)(local_10 + 0x30);
  local_3c0 = (vector<double,_std::allocator<double>_> *)(local_10 + 0x36);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x50466b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x504680);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x50468d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x50469a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x5046a7);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_10 + 0x58));
  local_439 = sVar3 != 0;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_3b0,(long)*local_10);
  local_444 = *pvVar4;
  local_448 = local_10[1];
  local_44c = 0;
  local_450 = 0;
  local_440 = local_444;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50,
             (size_type)in_stack_fffffffffffffa48,(value_type_conflict2 *)0x50473e);
  for (local_460 = 0; local_460 < *local_10; local_460 = local_460 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_3b0,(long)local_460);
    for (local_464 = *pvVar4; iVar9 = local_464,
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_3b0,(long)(local_460 + 1))
        , iVar9 < *pvVar4; local_464 = local_464 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_3b8,(long)local_464);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3f0,(long)*pvVar4);
      *pvVar4 = *pvVar4 + 1;
    }
  }
  local_468 = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50,
             in_stack_fffffffffffffa48);
  for (local_46c = 0; local_46c < local_10[1]; local_46c = local_46c + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_46c);
    iVar9 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3f0,(long)local_46c);
    local_470 = iVar9 + *pvVar4;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50,
               in_stack_fffffffffffffa48);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_46c);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3f0,(long)local_46c);
    *pvVar4 = vVar1;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),in_stack_fffffffffffffa68
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),in_stack_fffffffffffffa68
            );
  for (local_474 = 0; local_474 < *local_10; local_474 = local_474 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_3b0,(long)local_474);
    for (local_478 = *pvVar4; iVar9 = local_478,
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_3b0,(long)(local_474 + 1))
        , iVar9 < *pvVar4; local_478 = local_478 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_3b8,(long)local_478);
      iVar9 = local_474;
      local_47c = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3f0,(long)local_47c);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)*pvVar4);
      *pvVar4 = iVar9;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_3c0,(long)local_478);
      vVar8 = *pvVar5;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3f0,(long)local_47c);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_438,(long)*pvVar4);
      *pvVar5 = vVar8;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3f0,(long)local_47c);
      *pvVar4 = *pvVar4 + 1;
    }
  }
  local_480 = 0;
  local_484 = 0;
  for (local_488 = 0; iVar9 = local_484, local_488 < local_10[1]; local_488 = local_488 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)(local_488 + 1));
    iVar9 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_488);
    local_48c = iVar9 - *pvVar4;
    if (local_48c == 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_488);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)*pvVar4);
      local_490 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_488);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_438,(long)*pvVar4);
      local_498 = *pvVar5;
      if (local_498 <= 0.0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                            (long)local_488);
        if (-INFINITY < *pvVar5) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                              (long)local_488);
          local_4b0 = *pvVar5 / local_498;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                              (long)local_490);
          pdVar6 = std::min<double>(&local_4b0,pvVar5);
          dVar10 = *pdVar6;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                              (long)local_490);
          *pvVar5 = dVar10;
        }
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                            (long)local_488);
        if (*pvVar5 <= INFINITY && *pvVar5 != INFINITY) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                              (long)local_488);
          local_4b8 = *pvVar5 / local_498;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                              (long)local_490);
          pdVar6 = std::max<double>(&local_4b8,pvVar5);
          dVar10 = *pdVar6;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                              (long)local_490);
          *pvVar5 = dVar10;
        }
      }
      else {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                            (long)local_488);
        if (-INFINITY < *pvVar5) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                              (long)local_488);
          local_4a0 = *pvVar5 / local_498;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                              (long)local_490);
          pdVar6 = std::max<double>(&local_4a0,pvVar5);
          dVar10 = *pdVar6;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                              (long)local_490);
          *pvVar5 = dVar10;
        }
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                            (long)local_488);
        if (*pvVar5 <= INFINITY && *pvVar5 != INFINITY) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                              (long)local_488);
          local_4a8 = *pvVar5 / local_498;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                              (long)local_490);
          pdVar6 = std::min<double>(&local_4a8,pvVar5);
          dVar10 = *pdVar6;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                              (long)local_490);
          *pvVar5 = dVar10;
        }
      }
      local_44c = local_44c + 1;
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                          (long)local_488);
      vVar8 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                          (long)local_480);
      *pvVar5 = vVar8;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                          (long)local_488);
      vVar8 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                          (long)local_480);
      *pvVar5 = vVar8;
      if ((local_439 & 1) != 0) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_10 + 0x58),(long)local_488);
        this = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_10 + 0x58),(long)local_480);
        std::__cxx11::string::operator=((string *)this,(string *)pvVar7);
      }
      iVar9 = local_484;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_480);
      *pvVar4 = iVar9;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_488);
      for (local_4bc = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_408,(long)(local_488 + 1)), local_4bc < *pvVar4;
          local_4bc = local_4bc + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)local_4bc);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)local_484);
        *pvVar4 = vVar1;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_438,(long)local_4bc);
        vVar8 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_438,(long)local_484);
        *pvVar5 = vVar8;
        local_484 = local_484 + 1;
      }
      local_480 = local_480 + 1;
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_480);
  *pvVar4 = iVar9;
  local_10[1] = local_480;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),in_stack_fffffffffffffa68
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),in_stack_fffffffffffffa68
            );
  if ((local_439 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa68);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_10[1]);
  local_440 = *pvVar4;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50,
             (size_type)in_stack_fffffffffffffa48,(value_type_conflict2 *)0x50526a);
  for (local_4c4 = 0; local_4c4 < local_10[1]; local_4c4 = local_4c4 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_4c4);
    for (local_4c8 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_408,(long)(local_4c4 + 1)), local_4c8 < *pvVar4;
        local_4c8 = local_4c8 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)local_4c8);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)*pvVar4);
      *pvVar4 = *pvVar4 + 1;
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_3b0,0);
  *pvVar4 = 0;
  for (local_4cc = 0; local_4cc < *local_10; local_4cc = local_4cc + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_3b0,(long)local_4cc);
    iVar9 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)local_4cc);
    iVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_3b0,(long)(local_4cc + 1));
    *pvVar4 = iVar9 + iVar2;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_3b0,(long)local_4cc);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)local_4cc);
    *pvVar4 = vVar1;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),in_stack_fffffffffffffa68
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),in_stack_fffffffffffffa68
            );
  for (local_4d0 = 0; local_4d0 < local_10[1]; local_4d0 = local_4d0 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_408,(long)local_4d0);
    local_4d4 = *pvVar4;
    while (iVar9 = local_4d4,
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_408,(long)(local_4d0 + 1)), iVar9 < *pvVar4) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)local_4d4);
      iVar9 = *pvVar4;
      in_stack_fffffffffffffa50 = local_3b8;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)iVar9);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50,
                          (long)*pvVar4);
      *pvVar4 = local_4d0;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_438,(long)local_4d4);
      vVar8 = *pvVar5;
      in_stack_fffffffffffffa60 = local_3c0;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)iVar9);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffa60,(long)*pvVar4);
      *pvVar5 = vVar8;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)iVar9);
      *pvVar4 = *pvVar4 + 1;
      local_4d4 = local_4d4 + 1;
    }
  }
  highsLogUser(local_8,kWarning,"Removed %d rows of count 1\n",(ulong)local_44c);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa60);
  HighsLp::~HighsLp(in_stack_fffffffffffffa50);
  return;
}

Assistant:

void removeRowsOfCountOne(const HighsLogOptions& log_options, HighsLp& lp) {
  HighsLp row_wise_lp = lp;
  vector<HighsInt>& a_start = lp.a_matrix_.start_;
  vector<HighsInt>& a_index = lp.a_matrix_.index_;
  vector<double>& a_value = lp.a_matrix_.value_;
  vector<HighsInt> a_count;
  vector<HighsInt> ar_count;
  vector<HighsInt> ar_start;
  vector<HighsInt> ar_index;
  vector<double> ar_value;
  const bool has_name = lp.row_names_.size() > 0;
  HighsInt num_nz = a_start[lp.num_col_];
  const HighsInt original_num_nz = num_nz;
  const HighsInt original_num_row = lp.num_row_;
  HighsInt num_row_count_1 = 0;
  ar_count.assign(lp.num_row_, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++)
      ar_count[a_index[iEl]]++;
  }
  ar_start.push_back(0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    ar_start.push_back(ar_start[iRow] + ar_count[iRow]);
    ar_count[iRow] = ar_start[iRow];
  }
  ar_index.resize(num_nz);
  ar_value.resize(num_nz);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
      HighsInt iRow = a_index[iEl];
      ar_index[ar_count[iRow]] = iCol;
      ar_value[ar_count[iRow]] = a_value[iEl];
      ar_count[iRow]++;
    }
  }
  HighsInt newRow = 0;
  HighsInt newEl = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    const HighsInt row_count = ar_start[iRow + 1] - ar_start[iRow];
    if (row_count == 1) {
      HighsInt iCol = ar_index[ar_start[iRow]];
      double value = ar_value[ar_start[iRow]];
      assert(value);
      if (value > 0) {
        if (lp.row_lower_[iRow] > -kHighsInf)
          lp.col_lower_[iCol] =
              std::max(lp.row_lower_[iRow] / value, lp.col_lower_[iCol]);
        if (lp.row_upper_[iRow] < kHighsInf)
          lp.col_upper_[iCol] =
              std::min(lp.row_upper_[iRow] / value, lp.col_upper_[iCol]);
      } else {
        if (lp.row_lower_[iRow] > -kHighsInf)
          lp.col_upper_[iCol] =
              std::min(lp.row_lower_[iRow] / value, lp.col_upper_[iCol]);
        if (lp.row_upper_[iRow] < kHighsInf)
          lp.col_lower_[iCol] =
              std::max(lp.row_upper_[iRow] / value, lp.col_lower_[iCol]);
      }
      num_row_count_1++;
      continue;
    }
    lp.row_lower_[newRow] = lp.row_lower_[iRow];
    lp.row_upper_[newRow] = lp.row_upper_[iRow];
    if (has_name) lp.row_names_[newRow] = lp.row_names_[iRow];
    ar_start[newRow] = newEl;
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      ar_index[newEl] = ar_index[iEl];
      ar_value[newEl] = ar_value[iEl];
      newEl++;
    }
    newRow++;
  }
  ar_start[newRow] = newEl;
  lp.num_row_ = newRow;
  lp.row_lower_.resize(newRow);
  lp.row_upper_.resize(newRow);
  if (has_name) lp.row_names_.resize(newRow);

  num_nz = ar_start[lp.num_row_];
  a_count.assign(lp.num_col_, 0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++)
      a_count[ar_index[iEl]]++;
  }
  a_start[0] = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    a_start[iCol + 1] = a_start[iCol] + a_count[iCol];
    a_count[iCol] = a_start[iCol];
  }
  a_index.resize(num_nz);
  a_value.resize(num_nz);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      HighsInt iCol = ar_index[iEl];
      a_index[a_count[iCol]] = iRow;
      a_value[a_count[iCol]] = ar_value[iEl];
      a_count[iCol]++;
    }
  }
  assert(original_num_row - lp.num_row_ == num_row_count_1);
  assert(original_num_nz - num_nz == num_row_count_1);
  highsLogUser(log_options, HighsLogType::kWarning,
               "Removed %d rows of count 1\n", (int)num_row_count_1);
}